

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O3

boolean write_full(int fd,void *buf,size_t count)

{
  bool bVar1;
  ssize_t sVar2;
  size_t sVar3;
  
  if (0 < (long)count) {
    do {
      sVar2 = write(fd,buf,count);
      if (sVar2 == -1) {
        return '\0';
      }
      buf = (void *)((long)buf + sVar2);
      sVar3 = count - sVar2;
      bVar1 = sVar2 <= (long)count;
      count = sVar3;
    } while (sVar3 != 0 && bVar1);
  }
  return '\x01';
}

Assistant:

boolean write_full(int fd, const void *buf, size_t count)
{
	ssize_t ret, left;
	const char *buf2 = buf;

	left = count;
	while (left > 0) {
	    ret = write(fd, buf2, left);
	    if (ret == -1)
		return FALSE;
	    buf2 += ret;
	    left -= ret;
	}

	return TRUE;
}